

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O2

ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
* __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::operator=(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            *this,ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                  *rhs)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar5;
  long lVar6;
  uint uVar4;
  
  if (this != rhs) {
    uVar2 = this->themax;
    if ((int)uVar2 < rhs->thesize) {
      reMax(this,rhs->thesize);
      uVar2 = this->themax;
    }
    this->thesize = 0;
    this->thenum = 0;
    this->firstfree = ~uVar2;
    lVar6 = 0;
    for (lVar5 = 0; lVar5 < rhs->thesize; lVar5 = lVar5 + 1) {
      Item::operator=((Item *)((long)&(this->theitem->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem + lVar6),
                      (Item *)((long)&(rhs->theitem->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem + lVar6));
      lVar6 = lVar6 + 0x28;
    }
    for (lVar5 = 0; iVar1 = rhs->thenum, lVar5 < iVar1; lVar5 = lVar5 + 1) {
      this->thekey[lVar5] = rhs->thekey[lVar5];
    }
    uVar2 = rhs->themax;
    if ((uVar2 ^ rhs->firstfree) == 0xffffffff) {
      this->firstfree = ~this->themax;
    }
    else {
      this->firstfree = rhs->firstfree;
      uVar4 = rhs->firstfree;
      do {
        uVar3 = ~uVar4;
        uVar4 = rhs->theitem[(int)uVar3].info;
      } while ((uVar4 ^ uVar2) != 0xffffffff);
      this->theitem[(int)uVar3].info = ~this->themax;
    }
    this->thenum = iVar1;
    this->thesize = rhs->thesize;
  }
  return this;
}

Assistant:

ClassSet < T >& operator=(const ClassSet < T >& rhs)
   {
      if(this != &rhs)
      {
         int i;

         if(rhs.size() > max())
            reMax(rhs.size());

         clear();

         for(i = 0; i < rhs.size(); ++i)
            theitem[i] = std::move(rhs.theitem[i]);

         for(i = 0; i < rhs.num(); ++i)
            thekey[i] = rhs.thekey[i];

         if(rhs.firstfree == -rhs.themax - 1)
            firstfree = -themax - 1;
         else
         {
            firstfree = rhs.firstfree;
            i = rhs.firstfree;

            while(rhs.theitem[ -i - 1].info != -rhs.themax - 1)
               i = rhs.theitem[ -i - 1].info;

            theitem[ -i - 1].info = -themax - 1;
         }

         thenum = rhs.thenum;
         thesize = rhs.thesize;

         assert(isConsistent());
      }

      return *this;
   }